

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigTable.c
# Opt level: O0

Aig_Obj_t * Aig_TableLookup(Aig_Man_t *p,Aig_Obj_t *pGhost)

{
  Aig_Obj_t **ppAVar1;
  int iVar2;
  Aig_Type_t AVar3;
  Aig_Type_t AVar4;
  Aig_Obj_t *pAVar5;
  unsigned_long uVar6;
  Aig_Obj_t *pAVar7;
  Aig_Obj_t *local_28;
  Aig_Obj_t *pEntry;
  Aig_Obj_t *pGhost_local;
  Aig_Man_t *p_local;
  
  iVar2 = Aig_IsComplement(pGhost);
  if (iVar2 != 0) {
    __assert_fail("!Aig_IsComplement(pGhost)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aigTable.c"
                  ,0x77,"Aig_Obj_t *Aig_TableLookup(Aig_Man_t *, Aig_Obj_t *)");
  }
  iVar2 = Aig_ObjIsNode(pGhost);
  if (iVar2 != 0) {
    pAVar5 = Aig_ObjChild0(pGhost);
    if ((pAVar5 != (Aig_Obj_t *)0x0) && (pAVar5 = Aig_ObjChild1(pGhost), pAVar5 != (Aig_Obj_t *)0x0)
       ) {
      pAVar5 = Aig_ObjFanin0(pGhost);
      iVar2 = pAVar5->Id;
      pAVar5 = Aig_ObjFanin1(pGhost);
      if (pAVar5->Id <= iVar2) {
        __assert_fail("Aig_ObjFanin0(pGhost)->Id < Aig_ObjFanin1(pGhost)->Id",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aigTable.c"
                      ,0x7a,"Aig_Obj_t *Aig_TableLookup(Aig_Man_t *, Aig_Obj_t *)");
      }
      if (p->pTable != (Aig_Obj_t **)0x0) {
        pAVar5 = Aig_ObjFanin0(pGhost);
        iVar2 = Aig_ObjRefs(pAVar5);
        if (iVar2 != 0) {
          pAVar5 = Aig_ObjFanin1(pGhost);
          iVar2 = Aig_ObjRefs(pAVar5);
          if (iVar2 != 0) {
            ppAVar1 = p->pTable;
            uVar6 = Aig_Hash(pGhost,p->nTableSize);
            local_28 = ppAVar1[uVar6];
            do {
              if (local_28 == (Aig_Obj_t *)0x0) {
                return (Aig_Obj_t *)0x0;
              }
              pAVar5 = Aig_ObjChild0(local_28);
              pAVar7 = Aig_ObjChild0(pGhost);
              if (pAVar5 == pAVar7) {
                pAVar5 = Aig_ObjChild1(local_28);
                pAVar7 = Aig_ObjChild1(pGhost);
                if (pAVar5 == pAVar7) {
                  AVar3 = Aig_ObjType(local_28);
                  AVar4 = Aig_ObjType(pGhost);
                  if (AVar3 == AVar4) {
                    return local_28;
                  }
                }
              }
              local_28 = (local_28->field_0).pNext;
            } while( true );
          }
        }
      }
      return (Aig_Obj_t *)0x0;
    }
    __assert_fail("Aig_ObjChild0(pGhost) && Aig_ObjChild1(pGhost)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aigTable.c"
                  ,0x79,"Aig_Obj_t *Aig_TableLookup(Aig_Man_t *, Aig_Obj_t *)");
  }
  __assert_fail("Aig_ObjIsNode(pGhost)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aigTable.c"
                ,0x78,"Aig_Obj_t *Aig_TableLookup(Aig_Man_t *, Aig_Obj_t *)");
}

Assistant:

Aig_Obj_t * Aig_TableLookup( Aig_Man_t * p, Aig_Obj_t * pGhost )
{
    Aig_Obj_t * pEntry;
    assert( !Aig_IsComplement(pGhost) );
    assert( Aig_ObjIsNode(pGhost) );
    assert( Aig_ObjChild0(pGhost) && Aig_ObjChild1(pGhost) );
    assert( Aig_ObjFanin0(pGhost)->Id < Aig_ObjFanin1(pGhost)->Id );
    if ( p->pTable == NULL || !Aig_ObjRefs(Aig_ObjFanin0(pGhost)) || !Aig_ObjRefs(Aig_ObjFanin1(pGhost)) )
        return NULL;
    for ( pEntry = p->pTable[Aig_Hash(pGhost, p->nTableSize)]; pEntry; pEntry = pEntry->pNext )
    {
        if ( Aig_ObjChild0(pEntry) == Aig_ObjChild0(pGhost) && 
             Aig_ObjChild1(pEntry) == Aig_ObjChild1(pGhost) && 
             Aig_ObjType(pEntry) == Aig_ObjType(pGhost) )
            return pEntry;
    }
    return NULL;
}